

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

void __thiscall
icu_63::UVector::assign(UVector *this,UVector *other,UElementAssigner *assign,UErrorCode *ec)

{
  UBool UVar1;
  int local_2c;
  int32_t i;
  UErrorCode *ec_local;
  UElementAssigner *assign_local;
  UVector *other_local;
  UVector *this_local;
  
  UVar1 = ensureCapacity(this,other->count,ec);
  if (UVar1 != '\0') {
    setSize(this,other->count,ec);
    UVar1 = ::U_SUCCESS(*ec);
    if (UVar1 != '\0') {
      for (local_2c = 0; local_2c < other->count; local_2c = local_2c + 1) {
        if ((this->elements[local_2c].pointer != (void *)0x0) &&
           (this->deleter != (UObjectDeleter *)0x0)) {
          (*this->deleter)(this->elements[local_2c].pointer);
        }
        (*assign)(this->elements + local_2c,other->elements + local_2c);
      }
    }
  }
  return;
}

Assistant:

void UVector::assign(const UVector& other, UElementAssigner *assign, UErrorCode &ec) {
    if (ensureCapacity(other.count, ec)) {
        setSize(other.count, ec);
        if (U_SUCCESS(ec)) {
            for (int32_t i=0; i<other.count; ++i) {
                if (elements[i].pointer != 0 && deleter != 0) {
                    (*deleter)(elements[i].pointer);
                }
                (*assign)(&elements[i], &other.elements[i]);
            }
        }
    }
}